

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdflib.cpp
# Opt level: O0

void cumt(double *t,double *df,double *cum,double *ccum)

{
  double *ccum_local;
  double *cum_local;
  double *df_local;
  double *t_local;
  
  cumt::tt = *t * *t;
  cumt::dfptt = *df + cumt::tt;
  cumt::xx = *df / cumt::dfptt;
  cumt::yy = cumt::tt / cumt::dfptt;
  cumt::T1 = *df * 0.5;
  cumbet(&cumt::xx,&cumt::yy,&cumt::T1,&cumt::K2,&cumt::a,&cumt::oma);
  if (0.0 < *t) {
    *ccum = cumt::a * 0.5;
    *cum = cumt::oma + *ccum;
  }
  else {
    *cum = cumt::a * 0.5;
    *ccum = cumt::oma + *cum;
  }
  return;
}

Assistant:

void cumt ( double *t, double *df, double *cum, double *ccum )

//****************************************************************************80
//
//  Purpose:
//
//    CUMT evaluates the cumulative T distribution.
//
//  Reference:
//
//    Milton Abramowitz and Irene Stegun,
//    Handbook of Mathematical Functions,
//    Formula 26.5.27.
//
//  Parameters:
//
//    Input, double *T, the upper limit of integration.
//
//    Input, double *DF, the number of degrees of freedom of
//    the T distribution.
//
//    Output, double *CUM, *CCUM, the T distribution CDF and
//    complementary CDF.
//
{
  static double a;
  static double dfptt;
  static double K2 = 0.5e0;
  static double oma;
  static double T1;
  static double tt;
  static double xx;
  static double yy;

  tt = (*t) * (*t);
  dfptt = ( *df ) + tt;
  xx = *df / dfptt;
  yy = tt / dfptt;
  T1 = 0.5e0 * ( *df );
  cumbet ( &xx, &yy, &T1, &K2, &a, &oma );

  if ( *t <= 0.0e0 )
  {
    *cum = 0.5e0 * a;
    *ccum = oma + ( *cum );
  }
  else
  {
    *ccum = 0.5e0 * a;
    *cum = oma + ( *ccum );
  }
  return;
}